

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowSegmentType::~IfcFlowSegmentType(IfcFlowSegmentType *this)

{
  ~IfcFlowSegmentType(this);
  operator_delete(this,0x1c8);
  return;
}

Assistant:

IfcFlowSegmentType() : Object("IfcFlowSegmentType") {}